

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O3

void QTestResult::reset(void)

{
  QTest::currentTestData = 0;
  QTest::currentGlobalTestData = 0;
  QTest::currentTestFunc = 0;
  QTest::currentTestObjectName = 0;
  QTest::setFailed(false);
  QTest::expectFailComment = 0;
  QTest::expectFailMode = 0;
  QTest::blacklistCurrentTest = 0;
  QTestLog::resetCounters();
  return;
}

Assistant:

void QTestResult::reset()
{
    QTest::currentTestData = nullptr;
    QTest::currentGlobalTestData = nullptr;
    QTest::currentTestFunc = nullptr;
    QTest::currentTestObjectName = nullptr;
    QTest::resetFailed();

    QTest::expectFailComment = nullptr;
    QTest::expectFailMode = 0;
    QTest::blacklistCurrentTest = false;

    QTestLog::resetCounters();
}